

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshCheck(word *t,int nVars,int *pW)

{
  int iVar1;
  int local_78 [2];
  int Chow [16];
  int Chow0;
  int *pW_local;
  int nVars_local;
  word *t_local;
  
  iVar1 = Abc_TtIsUnate(t,nVars);
  if (iVar1 == 0) {
    t_local._4_4_ = 0;
  }
  else {
    Abc_TtMakePosUnate(t,nVars);
    Extra_ThreshComputeChow(t,nVars,local_78);
    Extra_ThreshSortByChow(t,nVars,local_78);
    t_local._4_4_ = Extra_ThreshSelectWeights(t,nVars,pW);
  }
  return t_local._4_4_;
}

Assistant:

int Extra_ThreshCheck(word * t, int nVars, int * pW) {
    int Chow0, Chow[16];
    if (!Abc_TtIsUnate(t, nVars))
        return 0;
    Abc_TtMakePosUnate(t, nVars);
    Chow0 = Extra_ThreshComputeChow(t, nVars, Chow);
    Extra_ThreshSortByChow(t, nVars, Chow);
    return Extra_ThreshSelectWeights(t, nVars, pW);
}